

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bv.c
# Opt level: O1

int bv_put_bits(bv_t *bv,unsigned_long bits,uint numbits)

{
  uint uVar1;
  uchar *puVar2;
  char cVar3;
  byte bVar4;
  int iVar5;
  uint uVar7;
  byte bVar8;
  ulong uVar9;
  byte bVar10;
  uint uVar11;
  ulong uVar12;
  byte *pbVar13;
  uint uVar6;
  
  if (bv == (bv_t *)0x0) {
    __assert_fail("bv != NULL","/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/bv.c",
                  0x7e,"int bv_put_bits(bv_t *, unsigned long, unsigned int)");
  }
  puVar2 = bv->data;
  if (puVar2 != (uchar *)0x0) {
    uVar6 = bv->idx;
    if (uVar6 < bv->len) {
      iVar5 = 0;
      if (numbits <= bv->len - uVar6) {
        uVar7 = uVar6 >> 3;
        uVar11 = uVar6 & 7;
        bv->idx = uVar6 + numbits;
        cVar3 = (char)numbits;
        uVar9 = bits << (-(cVar3 + ' ') & 0x3fU);
        pbVar13 = puVar2 + uVar7;
        bVar4 = (byte)(8 - uVar11);
        bVar8 = (puVar2[uVar7] >> (bVar4 & 0x1f)) << (bVar4 & 0x1f);
        uVar1 = uVar11 + numbits;
        uVar12 = uVar9 >> 0x18 & 0xff;
        if (uVar1 < 8) {
          bVar10 = 0;
          if (8 - uVar11 != numbits) {
            bVar10 = (char)(2 << ((bVar4 - cVar3) - 1 & 0x1f)) - 1U & puVar2[uVar7];
          }
          bVar8 = (byte)((uVar12 >> (8U - cVar3 & 0x3f)) << (bVar4 - cVar3 & 0x3f)) | bVar8;
        }
        else {
          *pbVar13 = bVar8 | (byte)(uVar12 >> (sbyte)uVar11);
          uVar9 = uVar9 << (bVar4 & 0x3f);
          if (uVar1 < 0x10) {
            uVar7 = uVar7 + 1;
          }
          else {
            uVar12 = (ulong)((uVar6 >> 3) + 1);
            uVar6 = 2;
            if (2 < uVar1 >> 3) {
              uVar6 = uVar1 >> 3;
            }
            iVar5 = uVar6 - 1;
            do {
              bv->data[uVar12] = (uchar)(uVar9 >> 0x18);
              uVar9 = uVar9 << 8;
              uVar12 = uVar12 + 1;
              iVar5 = iVar5 + -1;
            } while (iVar5 != 0);
            uVar7 = (uint)uVar12;
          }
          bVar4 = (byte)uVar1 & 7;
          bVar8 = 8 - bVar4;
          bVar8 = (byte)(((uVar9 >> 0x18) >> (bVar8 & 0x3f)) << (bVar8 & 0x3f));
          pbVar13 = bv->data + uVar7;
          bVar10 = (char)(2 << (bVar4 ^ 7)) - 1U & bv->data[uVar7];
        }
        *pbVar13 = bVar8 | bVar10;
        iVar5 = 1;
      }
      return iVar5;
    }
    __assert_fail("bv->len > bv->idx",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/bv.c",0x80,
                  "int bv_put_bits(bv_t *, unsigned long, unsigned int)");
  }
  __assert_fail("bv->data != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/bv.c",0x7f,
                "int bv_put_bits(bv_t *, unsigned long, unsigned int)");
}

Assistant:

int bv_put_bits(bv_t *bv, unsigned long bits, unsigned int numbits) {
  assert(bv != NULL);
  assert(bv->data != NULL);
  assert(bv->len > bv->idx);
  assert((numbits <= 32) ||
         "Can not write more than 32 bits into a bit vector");

  if (numbits > (bv->len - bv->idx))
    return 0;

  unsigned int cidx = bv->idx >> 3;
  unsigned int overflow = bv->idx & 0x07;

  bv->idx += numbits;
  /*M
    Put first bit as highest order bit of 32 bit long.
  **/
  bits <<= (32 - numbits);

  if ((overflow + numbits) < 8) {
    bv->data[cidx] =
      (HIGHERBITS(bv->data[cidx], overflow) << (8 - overflow)) |
      (HIGHERBITS(bits >> 24, numbits) << (8 - overflow - numbits)) |
      LOWERBITS(bv->data[cidx], 8 - overflow - numbits);
    return 1;
  } else {
    bv->data[cidx] =
      (HIGHERBITS(bv->data[cidx], overflow) << (8 - overflow)) |
      HIGHERBITS(bits >> 24, 8 - overflow);
  }
  cidx++;
  bits <<= 8 - overflow;

  unsigned int len = ((numbits + overflow) >> 3) + 1;
  unsigned int i;
  for (i = 1; i < len - 1; i++, bits <<= 8)
    bv->data[cidx++] = (bits >> 24) & 0xff;

  unsigned int lastbits = (overflow + numbits) & 0x07;
  bv->data[cidx] =
    (HIGHERBITS((bits >> 24) & 0xff, lastbits) << (8 - lastbits)) |
    LOWERBITS(bv->data[cidx], 8 - lastbits);

  return 1;
}